

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ExtensionSet::UnsafeShallowSwapExtension
          (ExtensionSet *this,ExtensionSet *other,int number)

{
  FieldDescriptor *pFVar1;
  anon_union_8_9_fdc4a54a_for_Extension_0 aVar2;
  FieldType FVar3;
  bool bVar4;
  undefined1 uVar5;
  bool bVar6;
  TrivialAtomicInt TVar7;
  FieldType FVar8;
  bool bVar9;
  undefined1 uVar10;
  bool bVar11;
  TrivialAtomicInt TVar12;
  Extension *pEVar13;
  Extension *pEVar14;
  string *psVar15;
  ExtensionSet *const_this_1;
  ExtensionSet *const_this;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar16;
  Extension __tmp;
  
  if (this != other) {
    pEVar13 = FindOrNull(this,number);
    pEVar14 = FindOrNull(other,number);
    if (pEVar13 != pEVar14) {
      if (this->arena_ == other->arena_) {
        psVar15 = (string *)0x0;
      }
      else {
        psVar15 = absl::lts_20240722::log_internal::MakeCheckOpString<void_const*,void_const*>
                            (this->arena_,other->arena_,"arena_ == other->arena_");
      }
      if (psVar15 != (string *)0x0) {
        UnsafeShallowSwapExtension();
      }
      if (pEVar13 == (Extension *)0x0 || pEVar14 == (Extension *)0x0) {
        if (pEVar13 == (Extension *)0x0) {
          pVar16 = Insert(this,number);
          pEVar13 = pVar16.first;
          FVar3 = pEVar14->type;
          bVar4 = pEVar14->is_repeated;
          uVar5 = pEVar14->field_0xa;
          bVar6 = pEVar14->is_packed;
          TVar7.int_ = (pEVar14->cached_size).int_[0];
          pEVar13->field_0 = pEVar14->field_0;
          pEVar13->type = FVar3;
          pEVar13->is_repeated = bVar4;
          pEVar13->field_0xa = uVar5;
          pEVar13->is_packed = bVar6;
          pEVar13->cached_size = (TrivialAtomicInt)TVar7.int_;
          pEVar13->descriptor = pEVar14->descriptor;
          this = other;
        }
        else {
          pVar16 = Insert(other,number);
          pEVar14 = pVar16.first;
          FVar3 = pEVar13->type;
          bVar4 = pEVar13->is_repeated;
          uVar5 = pEVar13->field_0xa;
          bVar6 = pEVar13->is_packed;
          TVar7.int_ = (pEVar13->cached_size).int_[0];
          pEVar14->field_0 = pEVar13->field_0;
          pEVar14->type = FVar3;
          pEVar14->is_repeated = bVar4;
          pEVar14->field_0xa = uVar5;
          pEVar14->is_packed = bVar6;
          pEVar14->cached_size = (TrivialAtomicInt)TVar7.int_;
          pEVar14->descriptor = pEVar13->descriptor;
        }
        Erase(this,number);
        return;
      }
      pFVar1 = pEVar13->descriptor;
      aVar2 = pEVar13->field_0;
      FVar8 = pEVar13->type;
      bVar9 = pEVar13->is_repeated;
      uVar10 = pEVar13->field_0xa;
      bVar11 = pEVar13->is_packed;
      TVar12.int_ = (pEVar13->cached_size).int_[0];
      pEVar13->descriptor = pEVar14->descriptor;
      FVar3 = pEVar14->type;
      bVar4 = pEVar14->is_repeated;
      uVar5 = pEVar14->field_0xa;
      bVar6 = pEVar14->is_packed;
      TVar7.int_ = (pEVar14->cached_size).int_[0];
      pEVar13->field_0 = pEVar14->field_0;
      pEVar13->type = FVar3;
      pEVar13->is_repeated = bVar4;
      pEVar13->field_0xa = uVar5;
      pEVar13->is_packed = bVar6;
      pEVar13->cached_size = (TrivialAtomicInt)TVar7.int_;
      pEVar14->descriptor = pFVar1;
      pEVar14->field_0 = aVar2;
      pEVar14->type = FVar8;
      pEVar14->is_repeated = bVar9;
      pEVar14->field_0xa = uVar10;
      pEVar14->is_packed = bVar11;
      pEVar14->cached_size = (TrivialAtomicInt)TVar12.int_;
    }
  }
  return;
}

Assistant:

void ExtensionSet::UnsafeShallowSwapExtension(ExtensionSet* other, int number) {
  if (this == other) return;

  Extension* this_ext = FindOrNull(number);
  Extension* other_ext = other->FindOrNull(number);

  if (this_ext == other_ext) return;

  ABSL_DCHECK_EQ(arena_, other->arena_);

  if (this_ext != nullptr && other_ext != nullptr) {
    std::swap(*this_ext, *other_ext);
  } else if (this_ext == nullptr) {
    *Insert(number).first = *other_ext;
    other->Erase(number);
  } else {
    *other->Insert(number).first = *this_ext;
    Erase(number);
  }
}